

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_SequenceApiTestWithKey_Test::TestBody
          (ConfidentialTransactionContext_SequenceApiTestWithKey_Test *this)

{
  initializer_list<cfd::UtxoData> __l;
  bool bVar1;
  byte bVar2;
  char *pcVar3;
  size_type sVar4;
  long lVar5;
  undefined1 extraout_DL;
  char *in_R9;
  AssertionResult gtest_ar_1;
  CfdException *anon_var_0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  ByteData tx;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  txouts;
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ct_addrs;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> utxos;
  ConfidentialTransactionContext txc;
  Amount fee;
  ElementsConfidentialAddress asset_address;
  ElementsConfidentialAddress address;
  UtxoData utxo2;
  UtxoData utxo1;
  ElementsAddressFactory factory;
  ConfidentialTxOutReference *in_stack_ffffffffffffd978;
  undefined7 in_stack_ffffffffffffd980;
  undefined1 in_stack_ffffffffffffd987;
  value_type *in_stack_ffffffffffffd988;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  *in_stack_ffffffffffffd990;
  char *in_stack_ffffffffffffd998;
  undefined4 in_stack_ffffffffffffd9a8;
  undefined1 in_stack_ffffffffffffd9ac;
  undefined1 in_stack_ffffffffffffd9ad;
  undefined1 in_stack_ffffffffffffd9ae;
  undefined1 in_stack_ffffffffffffd9af;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *in_stack_ffffffffffffd9b0;
  allocator *paVar6;
  undefined8 in_stack_ffffffffffffd9b8;
  undefined2 in_stack_ffffffffffffd9c0;
  undefined1 in_stack_ffffffffffffd9c2;
  undefined1 in_stack_ffffffffffffd9c3;
  undefined1 in_stack_ffffffffffffd9c4;
  undefined1 in_stack_ffffffffffffd9c5;
  undefined1 in_stack_ffffffffffffd9c6;
  undefined1 in_stack_ffffffffffffd9c7;
  UtxoData *local_25c8;
  AssertHelper local_2538;
  Message local_2530;
  int *local_2528;
  undefined4 local_251c;
  AssertionResult local_2518;
  AssertHelper local_2508;
  Message local_2500 [4];
  AssertHelper local_24e0;
  Message local_24d8;
  OutPoint local_24d0;
  AssertHelper local_24a8;
  Message local_24a0;
  SigHashType local_2498 [15];
  allocator local_2489;
  string local_2488 [32];
  string local_2468 [39];
  allocator local_2441;
  string local_2440 [32];
  Pubkey local_2420;
  OutPoint local_2408;
  AssertHelper local_23e0;
  Message local_23d8 [5];
  byte local_23a9;
  ConstCharPtr local_23a8;
  AssertHelper local_23a0;
  Message local_2398;
  OutPoint local_2390;
  AssertHelper local_2368;
  Message local_2360;
  SigHashType local_2358 [15];
  allocator local_2349;
  string local_2348 [32];
  string local_2328 [39];
  allocator local_2301;
  string local_2300 [32];
  Pubkey local_22e0;
  OutPoint local_22c8;
  ByteData local_22a0;
  string local_2288;
  AssertHelper local_2268;
  Message local_2260 [6];
  byte local_2229;
  AssertionResult local_2228;
  string local_2218;
  AssertHelper local_21f8;
  Message local_21f0 [6];
  byte local_21b9;
  AssertionResult local_21b8;
  string local_21a8;
  AssertHelper local_2188;
  Message local_2180 [6];
  byte local_2149;
  AssertionResult local_2148;
  AssertHelper local_2138;
  Message local_2130;
  undefined4 local_2124;
  size_type local_2120;
  AssertionResult local_2118;
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  local_2108 [24];
  AssertHelper local_20f0;
  Message local_20e8;
  undefined1 local_20e0 [24];
  AssertHelper local_20c8;
  Message local_20c0 [2];
  UtxoData *local_20b0;
  UtxoData local_20a8 [1264];
  UtxoData local_1bb8 [1264];
  UtxoData *local_16c8;
  undefined8 local_16c0;
  Amount local_16a0 [376];
  _func_int **local_1528;
  undefined1 local_1520;
  undefined1 local_1518 [56];
  AssertHelper local_14e0;
  Message local_14d8 [2];
  OutPoint local_14c8 [4];
  undefined1 local_1410 [24];
  string local_13f8 [32];
  ElementsConfidentialAddress local_13d8 [439];
  allocator local_1221;
  string local_1220 [32];
  ElementsConfidentialAddress local_1200 [439];
  allocator local_1049;
  string local_1048 [32];
  ConfidentialValue local_1028;
  allocator local_ff9;
  string local_ff8 [32];
  BlindFactor local_fd8;
  allocator local_fb1;
  string local_fb0 [32];
  BlindFactor local_f90;
  allocator local_f69;
  string local_f68 [32];
  ConfidentialAssetId local_f48;
  _func_int **local_f20;
  undefined1 local_f18;
  allocator local_f09;
  string local_f08 [32];
  string local_ee8 [383];
  allocator local_d69;
  string local_d68 [32];
  Script local_d48;
  allocator local_d09;
  string local_d08 [32];
  Txid local_ce8;
  undefined8 local_cc8 [5];
  Txid local_ca0;
  uint local_c80;
  Script local_c78 [2];
  Address local_c08 [376];
  string local_a90 [32];
  undefined1 local_a70 [504];
  BlindFactor local_878;
  BlindFactor local_858;
  ConfidentialValue local_838 [2];
  allocator local_7d1;
  string local_7d0 [32];
  ConfidentialAssetId local_7b0;
  undefined8 local_788;
  undefined1 local_780;
  allocator local_771;
  string local_770 [32];
  string local_750 [383];
  allocator local_5d1;
  string local_5d0 [32];
  Script local_5b0;
  allocator local_571;
  string local_570 [32];
  Txid local_550;
  undefined8 local_520 [5];
  Txid local_4f8;
  uint local_4d8;
  Script local_4d0 [2];
  Address local_460 [376];
  string local_2e8 [32];
  undefined8 local_2c8;
  undefined1 local_2c0;
  undefined4 local_2b8;
  undefined8 local_2b0;
  ConfidentialAssetId local_2a8 [15];
  ElementsAddressFactory local_30 [48];
  
  cfd::ElementsAddressFactory::ElementsAddressFactory(local_30,kElementsRegtest);
  cfd::UtxoData::UtxoData((UtxoData *)local_520);
  local_520[0] = 0;
  local_2b0 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_570,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",&local_571
            );
  cfd::core::Txid::Txid(&local_550,local_570);
  cfd::core::Txid::operator=(&local_4f8,&local_550);
  cfd::core::Txid::~Txid((Txid *)0x1e2f86);
  std::__cxx11::string::~string(local_570);
  std::allocator<char>::~allocator((allocator<char> *)&local_571);
  local_4d8 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_5d0,"76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac",&local_5d1);
  cfd::core::Script::Script(&local_5b0,local_5d0);
  cfd::core::Script::operator=(local_4d0,&local_5b0);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  std::__cxx11::string::~string(local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_770,"2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph",&local_771);
  cfd::AddressFactory::GetAddress(local_750);
  cfd::core::Address::operator=(local_460,(Address *)local_750);
  cfd::core::Address::~Address
            ((Address *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  std::__cxx11::string::~string(local_770);
  std::allocator<char>::~allocator((allocator<char> *)&local_771);
  std::__cxx11::string::operator=
            (local_2e8,"pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)");
  cfd::core::Amount::Amount((Amount *)&local_788,10000000);
  local_2c0 = local_780;
  local_2c8 = local_788;
  local_2b8 = 2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_7d0,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",&local_7d1
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_7b0,local_7d0);
  cfd::core::ConfidentialAssetId::operator=(local_2a8,&local_7b0);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1e3184);
  std::__cxx11::string::~string(local_7d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7d1);
  cfd::UtxoData::UtxoData((UtxoData *)local_cc8);
  local_cc8[0] = 0;
  local_a70._24_8_ = (pointer)0x0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d08,"31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3",&local_d09
            );
  cfd::core::Txid::Txid(&local_ce8,local_d08);
  cfd::core::Txid::operator=(&local_ca0,&local_ce8);
  cfd::core::Txid::~Txid((Txid *)0x1e3233);
  std::__cxx11::string::~string(local_d08);
  std::allocator<char>::~allocator((allocator<char> *)&local_d09);
  local_c80 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_d68,"a9145d54db96a28f844a744e393fcd699d6f825b284187",&local_d69);
  cfd::core::Script::Script(&local_d48,local_d68);
  cfd::core::Script::operator=(local_c78,&local_d48);
  cfd::core::Script::~Script
            ((Script *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  std::__cxx11::string::~string(local_d68);
  std::allocator<char>::~allocator((allocator<char> *)&local_d69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f08,"XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE",&local_f09);
  cfd::AddressFactory::GetAddress(local_ee8);
  cfd::core::Address::operator=(local_c08,(Address *)local_ee8);
  cfd::core::Address::~Address
            ((Address *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  std::__cxx11::string::~string(local_f08);
  std::allocator<char>::~allocator((allocator<char> *)&local_f09);
  std::__cxx11::string::operator=
            (local_a90,
             "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))");
  cfd::core::Amount::Amount((Amount *)&local_f20,180000);
  local_a70[8] = local_f18;
  local_a70._0_8_ = local_f20;
  local_a70._16_4_ = 6;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_f68,"849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735",&local_f69
            );
  cfd::core::ConfidentialAssetId::ConfidentialAssetId(&local_f48,local_f68);
  cfd::core::ConfidentialAssetId::operator=((ConfidentialAssetId *)(local_a70 + 0x20),&local_f48);
  cfd::core::ConfidentialAssetId::~ConfidentialAssetId((ConfidentialAssetId *)0x1e3431);
  std::__cxx11::string::~string(local_f68);
  std::allocator<char>::~allocator((allocator<char> *)&local_f69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_fb0,"23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e",&local_fb1
            );
  cfd::core::BlindFactor::BlindFactor(&local_f90,local_fb0);
  cfd::core::BlindFactor::operator=(&local_878,&local_f90);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x1e34b9);
  std::__cxx11::string::~string(local_fb0);
  std::allocator<char>::~allocator((allocator<char> *)&local_fb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_ff8,"6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc",&local_ff9
            );
  cfd::core::BlindFactor::BlindFactor(&local_fd8,local_ff8);
  cfd::core::BlindFactor::operator=(&local_858,&local_fd8);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x1e3541);
  std::__cxx11::string::~string(local_ff8);
  std::allocator<char>::~allocator((allocator<char> *)&local_ff9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1048,"09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa",
             &local_1049);
  cfd::core::ConfidentialValue::ConfidentialValue(&local_1028,local_1048);
  cfd::core::ConfidentialValue::operator=(local_838,&local_1028);
  cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x1e35c9);
  std::__cxx11::string::~string(local_1048);
  std::allocator<char>::~allocator((allocator<char> *)&local_1049);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1220,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz",
             &local_1221);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_1200,local_1220);
  std::__cxx11::string::~string(local_1220);
  std::allocator<char>::~allocator((allocator<char> *)&local_1221);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_13f8,
             "CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS",
             (allocator *)(local_1410 + 0x17));
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(local_13d8,local_13f8);
  std::__cxx11::string::~string(local_13f8);
  std::allocator<char>::~allocator((allocator<char> *)(local_1410 + 0x17));
  cfd::core::Amount::Amount((Amount *)local_1410,10000);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)local_14c8,2,0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::AddInput((UtxoData *)local_14c8);
    }
  }
  else {
    testing::Message::Message(local_14d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_14e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x2ff,
               "Expected: txc.AddInput(utxo1) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_14e0,local_14d8);
    testing::internal::AssertHelper::~AssertHelper(&local_14e0);
    testing::Message::~Message((Message *)0x1e3d85);
  }
  cfd::core::OutPoint::OutPoint((OutPoint *)(local_1518 + 0x10),&local_ca0,local_c80);
  cfd::ConfidentialTransactionContext::AddTxIn(local_14c8);
  cfd::core::OutPoint::~OutPoint((OutPoint *)0x1e3e12);
  local_1528 = (_func_int **)cfd::core::operator-((Amount *)&local_2c8,(Amount *)local_1410);
  local_1520 = extraout_DL;
  local_1518._0_8_ = local_1528;
  local_1518[8] = extraout_DL;
  cfd::ConfidentialTransactionContext::AddTxOut
            ((ElementsConfidentialAddress *)local_14c8,(Amount *)local_1200,
             (ConfidentialAssetId *)local_1518,SUB81(local_2a8,0));
  cfd::core::ElementsConfidentialAddress::GetUnblindedAddress();
  cfd::ConfidentialTransactionContext::AddTxOut
            ((Address *)local_14c8,local_16a0,(ConfidentialAssetId *)local_a70);
  cfd::core::Address::~Address
            ((Address *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  cfd::core::ConfidentialTransaction::AddTxOutFee
            ((Amount *)local_14c8,(ConfidentialAssetId *)local_1410);
  local_20b0 = local_20a8;
  cfd::UtxoData::UtxoData(local_20b0,(UtxoData *)local_520);
  local_20b0 = local_1bb8;
  cfd::UtxoData::UtxoData(local_20b0,(UtxoData *)local_cc8);
  local_16c8 = local_20a8;
  local_16c0 = 2;
  std::allocator<cfd::UtxoData>::allocator((allocator<cfd::UtxoData> *)0x1e3f77);
  __l._M_len._0_2_ = in_stack_ffffffffffffd9c0;
  __l._M_array = (iterator)in_stack_ffffffffffffd9b8;
  __l._M_len._2_1_ = in_stack_ffffffffffffd9c2;
  __l._M_len._3_1_ = in_stack_ffffffffffffd9c3;
  __l._M_len._4_1_ = in_stack_ffffffffffffd9c4;
  __l._M_len._5_1_ = in_stack_ffffffffffffd9c5;
  __l._M_len._6_1_ = in_stack_ffffffffffffd9c6;
  __l._M_len._7_1_ = in_stack_ffffffffffffd9c7;
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::vector
            (in_stack_ffffffffffffd9b0,__l,
             (allocator_type *)
             CONCAT17(in_stack_ffffffffffffd9af,
                      CONCAT16(in_stack_ffffffffffffd9ae,
                               CONCAT15(in_stack_ffffffffffffd9ad,
                                        CONCAT14(in_stack_ffffffffffffd9ac,in_stack_ffffffffffffd9a8
                                                )))));
  std::allocator<cfd::UtxoData>::~allocator((allocator<cfd::UtxoData> *)0x1e3fab);
  local_25c8 = (UtxoData *)&local_16c8;
  do {
    local_25c8 = local_25c8 + -0x4f0;
    cfd::UtxoData::~UtxoData
              ((UtxoData *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  } while (local_25c8 != local_20a8);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::CollectInputUtxo((vector *)local_14c8);
    }
  }
  else {
    testing::Message::Message(local_20c0);
    testing::internal::AssertHelper::AssertHelper
              (&local_20c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x306,
               "Expected: txc.CollectInputUtxo(utxos) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_20c8,local_20c0);
    testing::internal::AssertHelper::~AssertHelper(&local_20c8);
    testing::Message::~Message((Message *)0x1e4250);
  }
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
            *)0x1e42ad);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::push_back((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
               *)in_stack_ffffffffffffd990,in_stack_ffffffffffffd988);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_R9 = (char *)0x0;
      cfd::ConfidentialTransactionContext::Blind
                ((vector *)local_14c8,(long)local_20e0,1,0,(vector *)0x34);
    }
  }
  else {
    testing::Message::Message(&local_20e8);
    testing::internal::AssertHelper::AssertHelper
              (&local_20f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x30a,
               "Expected: txc.Blind(&ct_addrs) doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_20f0,&local_20e8);
    testing::internal::AssertHelper::~AssertHelper(&local_20f0);
    testing::Message::~Message((Message *)0x1e43d5);
  }
  cfd::core::ConfidentialTransaction::GetTxOutList();
  local_2120 = std::
               vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
               ::size(local_2108);
  local_2124 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_ffffffffffffd998,(char *)in_stack_ffffffffffffd990,
             (unsigned_long *)in_stack_ffffffffffffd988,
             (int *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2118);
  if (!bVar1) {
    testing::Message::Message(&local_2130);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e44f4);
    testing::internal::AssertHelper::AssertHelper
              (&local_2138,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x30c,pcVar3);
    testing::internal::AssertHelper::operator=(&local_2138,&local_2130);
    testing::internal::AssertHelper::~AssertHelper(&local_2138);
    testing::Message::~Message((Message *)0x1e4551);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e45a9);
  sVar4 = std::
          vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
          ::size(local_2108);
  if (sVar4 == 3) {
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](local_2108,0);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue(in_stack_ffffffffffffd978);
    local_2149 = cfd::core::ConfidentialValue::HasBlinding();
    local_2149 = local_2149 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980),
               (bool *)in_stack_ffffffffffffd978,(type *)0x1e461c);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x1e462b);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2148);
    if (!bVar1) {
      testing::Message::Message(local_2180);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_21a8,(internal *)&local_2148,
                 (AssertionResult *)"txouts[0].GetConfidentialValue().HasBlinding()","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2188,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x30e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2188,local_2180);
      testing::internal::AssertHelper::~AssertHelper(&local_2188);
      std::__cxx11::string::~string((string *)&local_21a8);
      testing::Message::~Message((Message *)0x1e4747);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e47c2);
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](local_2108,1);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue(in_stack_ffffffffffffd978);
    local_21b9 = cfd::core::ConfidentialValue::HasBlinding();
    local_21b9 = local_21b9 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980),
               (bool *)in_stack_ffffffffffffd978,(type *)0x1e481f);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x1e482e);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_21b8);
    if (!bVar1) {
      testing::Message::Message(local_21f0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_2218,(internal *)&local_21b8,
                 (AssertionResult *)"txouts[1].GetConfidentialValue().HasBlinding()","false","true",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_21f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x30f,pcVar3);
      testing::internal::AssertHelper::operator=(&local_21f8,local_21f0);
      testing::internal::AssertHelper::~AssertHelper(&local_21f8);
      std::__cxx11::string::~string((string *)&local_2218);
      testing::Message::~Message((Message *)0x1e494a);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e49c5);
    std::
    vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
    ::operator[](local_2108,2);
    cfd::core::ConfidentialTxOutReference::GetConfidentialValue(in_stack_ffffffffffffd978);
    bVar2 = cfd::core::ConfidentialValue::HasBlinding();
    local_2229 = ~bVar2 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980),
               (bool *)in_stack_ffffffffffffd978,(type *)0x1e4a24);
    cfd::core::ConfidentialValue::~ConfidentialValue((ConfidentialValue *)0x1e4a33);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2228);
    if (!bVar1) {
      testing::Message::Message(local_2260);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_2288,(internal *)&local_2228,
                 (AssertionResult *)"txouts[2].GetConfidentialValue().HasBlinding()","true","false",
                 in_R9);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_2268,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x310,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2268,local_2260);
      testing::internal::AssertHelper::~AssertHelper(&local_2268);
      std::__cxx11::string::~string((string *)&local_2288);
      testing::Message::~Message((Message *)0x1e4b4f);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e4bc7);
  }
  cfd::core::ByteData::ByteData(&local_22a0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_22c8,&local_4f8,local_4d8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2300,"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b",
                 &local_2301);
      cfd::core::Pubkey::Pubkey(&local_22e0,local_2300);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2348,"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5",&local_2349);
      cfd::core::Privkey::FromWif(local_2328,(NetType)local_2348,true);
      cfd::core::SigHashType::SigHashType(local_2358);
      cfd::ConfidentialTransactionContext::SignWithKey
                (local_14c8,&local_22c8,&local_22e0,local_2328,local_2358,1);
      cfd::core::Privkey::~Privkey((Privkey *)0x1e4d18);
      std::__cxx11::string::~string(local_2348);
      std::allocator<char>::~allocator((allocator<char> *)&local_2349);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x1e4d3f);
      std::__cxx11::string::~string(local_2300);
      std::allocator<char>::~allocator((allocator<char> *)&local_2301);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x1e4d66);
    }
  }
  else {
    testing::Message::Message(&local_2360);
    testing::internal::AssertHelper::AssertHelper
              (&local_2368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x318,
               "Expected: txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout), Pubkey(\"0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b\"), Privkey::FromWif( \"cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_2368,&local_2360);
    testing::internal::AssertHelper::~AssertHelper(&local_2368);
    testing::Message::~Message((Message *)0x1e4ef8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_2390,&local_4f8,local_4d8);
      cfd::ConfidentialTransactionContext::Verify(local_14c8);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x1e4fb5);
    }
  }
  else {
    testing::Message::Message(&local_2398);
    testing::internal::AssertHelper::AssertHelper
              (&local_23a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x319,
               "Expected: txc.Verify(OutPoint(utxo1.txid, utxo1.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_23a0,&local_2398);
    testing::internal::AssertHelper::~AssertHelper(&local_23a0);
    testing::Message::~Message((Message *)0x1e507f);
  }
  testing::internal::ConstCharPtr::ConstCharPtr(&local_23a8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool(&local_23a8);
  if (bVar1) {
    local_23a9 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize();
      cfd::core::ByteData::operator=
                ((ByteData *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980),
                 (ByteData *)in_stack_ffffffffffffd978);
      cfd::core::ByteData::~ByteData((ByteData *)0x1e5159);
    }
    if ((local_23a9 & 1) != 0) goto LAB_001e52af;
    local_23a8.value =
         "Expected: (tx = txc.Finalize()) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_23d8);
  testing::internal::AssertHelper::AssertHelper
            (&local_23e0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
             ,0x31b,local_23a8.value);
  testing::internal::AssertHelper::operator=(&local_23e0,local_23d8);
  testing::internal::AssertHelper::~AssertHelper(&local_23e0);
  testing::Message::~Message((Message *)0x1e5264);
LAB_001e52af:
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_2408,&local_ca0,local_c80);
      paVar6 = &local_2441;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2440,"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27",
                 paVar6);
      cfd::core::Pubkey::Pubkey(&local_2420,local_2440);
      paVar6 = &local_2489;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2488,"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP",paVar6);
      cfd::core::Privkey::FromWif(local_2468,(NetType)local_2488,true);
      cfd::core::SigHashType::SigHashType(local_2498);
      cfd::ConfidentialTransactionContext::SignWithKey
                (local_14c8,&local_2408,&local_2420,local_2468,local_2498,1);
      cfd::core::Privkey::~Privkey((Privkey *)0x1e53dd);
      std::__cxx11::string::~string(local_2488);
      std::allocator<char>::~allocator((allocator<char> *)&local_2489);
      cfd::core::Pubkey::~Pubkey((Pubkey *)0x1e5404);
      std::__cxx11::string::~string(local_2440);
      std::allocator<char>::~allocator((allocator<char> *)&local_2441);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x1e542b);
    }
  }
  else {
    testing::Message::Message(&local_24a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_24a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,800,
               "Expected: txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout), Pubkey(\"0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27\"), Privkey::FromWif( \"cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP\", NetType::kTestnet)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_24a8,&local_24a0);
    testing::internal::AssertHelper::~AssertHelper(&local_24a8);
    testing::Message::~Message((Message *)0x1e55a4);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(&local_24d0,&local_ca0,local_c80);
      cfd::ConfidentialTransactionContext::Verify(local_14c8);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x1e5661);
    }
  }
  else {
    testing::Message::Message(&local_24d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_24e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x321,
               "Expected: txc.Verify(OutPoint(utxo2.txid, utxo2.vout)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_24e0,&local_24d8);
    testing::internal::AssertHelper::~AssertHelper(&local_24e0);
    testing::Message::~Message((Message *)0x1e572b);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ConfidentialTransactionContext::Finalize();
      cfd::core::ByteData::operator=
                ((ByteData *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980),
                 (ByteData *)in_stack_ffffffffffffd978);
      cfd::core::ByteData::~ByteData((ByteData *)0x1e57dc);
    }
  }
  else {
    testing::Message::Message(local_2500);
    testing::internal::AssertHelper::AssertHelper
              (&local_2508,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x322,
               "Expected: tx = txc.Finalize() doesn\'t throw an exception.\n  Actual: it throws.");
    testing::internal::AssertHelper::operator=(&local_2508,local_2500);
    testing::internal::AssertHelper::~AssertHelper(&local_2508);
    testing::Message::~Message((Message *)0x1e5883);
  }
  lVar5 = cfd::core::ByteData::GetDataSize();
  if (((lVar5 != 0x23e1) &&
      (pcVar3 = (char *)cfd::core::ByteData::GetDataSize(), pcVar3 != (char *)0x23e2)) &&
     (in_stack_ffffffffffffd990 =
           (vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
            *)cfd::core::ByteData::GetDataSize(),
     in_stack_ffffffffffffd990 !=
     (vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
      *)0x23e3)) {
    local_251c = 0;
    local_2528 = (int *)cfd::core::ByteData::GetDataSize();
    testing::internal::EqHelper<true>::Compare<int,unsigned_long>
              (pcVar3,(char *)in_stack_ffffffffffffd990,local_2528,
               (unsigned_long *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980),
               in_stack_ffffffffffffd978);
    in_stack_ffffffffffffd987 = testing::AssertionResult::operator_cast_to_bool(&local_2518);
    if (!(bool)in_stack_ffffffffffffd987) {
      testing::Message::Message(&local_2530);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x1e59f2);
      testing::internal::AssertHelper::AssertHelper
                (&local_2538,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
                 ,0x325,pcVar3);
      testing::internal::AssertHelper::operator=(&local_2538,&local_2530);
      testing::internal::AssertHelper::~AssertHelper(&local_2538);
      testing::Message::~Message((Message *)0x1e5a4d);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x1e5aa2);
  }
  cfd::core::ByteData::~ByteData((ByteData *)0x1e5ac3);
  std::
  vector<cfd::core::ConfidentialTxOutReference,_std::allocator<cfd::core::ConfidentialTxOutReference>_>
  ::~vector(in_stack_ffffffffffffd990);
  std::
  vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
  ::~vector((vector<cfd::core::ElementsConfidentialAddress,_std::allocator<cfd::core::ElementsConfidentialAddress>_>
             *)in_stack_ffffffffffffd990);
  std::vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>::~vector
            ((vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *)in_stack_ffffffffffffd990);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)
             CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)
             CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  cfd::UtxoData::~UtxoData
            ((UtxoData *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  cfd::UtxoData::~UtxoData
            ((UtxoData *)CONCAT17(in_stack_ffffffffffffd987,in_stack_ffffffffffffd980));
  cfd::ElementsAddressFactory::~ElementsAddressFactory((ElementsAddressFactory *)0x1e5b38);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SequenceApiTestWithKey)
{
  ElementsAddressFactory factory(NetType::kElementsRegtest);
  // Address1
  // pubkey: '0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b',
  // privkey: 'cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5'
  UtxoData utxo1;
  utxo1.block_height = 0;
  utxo1.binary_data = nullptr;
  utxo1.txid = Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3");
  utxo1.vout = 0;
  utxo1.locking_script = Script("76a914f330ed8383f8afdc977dd88600eb8ff120ba15e488ac");
  // utxo1.redeem_script = Script("");
  utxo1.address = factory.GetAddress("2dwbdChKUXiSWECFEzLdmegbRtGAAHTC2ph");
  utxo1.descriptor = "pkh(0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b)";
  utxo1.amount = Amount(int64_t{10000000});
  utxo1.address_type = AddressType::kP2pkhAddress;
  utxo1.asset = ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225");
  // utxo1.asset_blind_factor = BlindFactor("");
  // utxo1.amount_blind_factor = BlindFactor("");
  // utxo1.value_commitment = ConfidentialValue("");

  // Address2 (pattern-x1)
  // pubkey: '0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27',
  // privkey: 'cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP'
  // blinding key: '66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83'
  UtxoData utxo2;
  utxo2.block_height = 0;
  utxo2.binary_data = nullptr;
  utxo2.txid = Txid("31559192b619fd52b2cc0ca54d33778acae393ed31c453e29301a3919763b9e3");
  utxo2.vout = 0;
  utxo2.locking_script = Script("a9145d54db96a28f844a744e393fcd699d6f825b284187");
  // utxo1.redeem_script = Script("");
  utxo2.address = factory.GetAddress("XKrjM1JtrjasbbrdJ9Ci51dmkZ1DMxzPJE");
  utxo2.descriptor = "sh(wpkh(0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27))";
  utxo2.amount = Amount(int64_t{180000});
  utxo2.address_type = AddressType::kP2shP2wpkhAddress;
  utxo2.asset = ConfidentialAssetId("849cabdb3b0df8a05b97c5df0f2e2f891d5a94fccf6dbe9907ee34b477a1e735");
  // utxo2.confidential_address;
  utxo2.asset_blind_factor = BlindFactor("23b44363de1069842dff58ac6c965f75af71949e58d823d7bfcc963134db0b3e");
  utxo2.amount_blind_factor = BlindFactor("6dfe8c49f10c40cac178da4056dbf55eb11fa26e3169f41019e88252d86c42bc");
  utxo2.value_commitment = ConfidentialValue("09da970d871982c2405b2d4bff4f455e4907bedaf95c205f94015809f6bd9c59fa");

  // "2dngFLukCWCjXVusBspjAuGsCRwW4eyAtg6";
  ElementsConfidentialAddress address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3ggeFikyDxDW5gU8WmTXtb2HWWjc23YXZz");
  // "2dbH8YS7rqRDM1F7EXrGBXvZywXxuEQtZ2z"
  ElementsConfidentialAddress asset_address("CTEkmnc7qLfRvwS5Z39KrrARxy8ugtXtgWrSMpqdbfk6am3VHXTF8dZAhKb1iBAnzYXEj527CSdfj2PS");

  Amount fee(int64_t{10000});
  ConfidentialTransactionContext txc(2, 0);
  EXPECT_NO_THROW(txc.AddInput(utxo1));
  txc.AddTxIn(OutPoint(utxo2.txid, utxo2.vout));
  txc.AddTxOut(address, utxo1.amount - fee, utxo1.asset);
  txc.AddTxOut(asset_address.GetUnblindedAddress(), utxo2.amount, utxo2.asset);
  txc.AddTxOutFee(fee, utxo1.asset);

  std::vector<cfd::UtxoData> utxos{utxo1, utxo2};
  EXPECT_NO_THROW(txc.CollectInputUtxo(utxos));

  std::vector<cfd::core::ElementsConfidentialAddress> ct_addrs;
  ct_addrs.push_back(asset_address);
  EXPECT_NO_THROW(txc.Blind(&ct_addrs));
  std::vector<ConfidentialTxOutReference> txouts = txc.GetTxOutList();
  EXPECT_EQ(txouts.size(), 3);
  if (txouts.size() == 3) {
    EXPECT_TRUE(txouts[0].GetConfidentialValue().HasBlinding());
    EXPECT_TRUE(txouts[1].GetConfidentialValue().HasBlinding());
    EXPECT_FALSE(txouts[2].GetConfidentialValue().HasBlinding());
  }

  ByteData tx;

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo1.txid, utxo1.vout),
      Pubkey("0359bc91953b251ae501758673b9d6dd78eafa327190741536025d92217a3f567b"),
      Privkey::FromWif(
          "cQSo3DLRNg4G57hRkbo2d2pY3QSuRM9eact7LroG46XyZbZByxi5", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo1.txid, utxo1.vout)));

  EXPECT_THROW((tx = txc.Finalize()), CfdException);

  EXPECT_NO_THROW(txc.SignWithKey(OutPoint(utxo2.txid, utxo2.vout),
      Pubkey("0206d4fabad19c61ffb180fa8a6d0f973e11485e60115557179786f7ea5d806a27"),
      Privkey::FromWif(
          "cVtoSAzA814NCpEjz1Gumv2c5jCQ1f8Axcd58NDeds8Wxrn9dMVP", NetType::kTestnet)));
  EXPECT_NO_THROW(txc.Verify(OutPoint(utxo2.txid, utxo2.vout)));
  EXPECT_NO_THROW(tx = txc.Finalize());

  if ((tx.GetDataSize() != 9185) && (tx.GetDataSize() != 9186) && (tx.GetDataSize() != 9187)) {
    EXPECT_EQ(0, tx.GetDataSize());
  }
}